

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockaction.cc
# Opt level: O0

void __thiscall ConditionalJoin::moveCbranch(ConditionalJoin *this)

{
  mapped_type *ppVVar1;
  MergePair local_38;
  Varnode *local_28;
  Varnode *vn;
  Varnode *vn2;
  Varnode *vn1;
  ConditionalJoin *this_local;
  
  vn1 = (Varnode *)this;
  vn2 = PcodeOp::getIn(this->cbranch1,1);
  vn = PcodeOp::getIn(this->cbranch2,1);
  Funcdata::opUninsert(this->data,this->cbranch1);
  Funcdata::opInsertEnd(this->data,this->cbranch1,this->joinblock);
  if (vn2 == vn) {
    local_28 = vn2;
  }
  else {
    MergePair::MergePair(&local_38,vn2,vn);
    ppVVar1 = std::
              map<ConditionalJoin::MergePair,_Varnode_*,_std::less<ConditionalJoin::MergePair>,_std::allocator<std::pair<const_ConditionalJoin::MergePair,_Varnode_*>_>_>
              ::operator[](&this->mergeneed,&local_38);
    local_28 = *ppVVar1;
  }
  Funcdata::opSetInput(this->data,this->cbranch1,local_28,1);
  Funcdata::opDestroy(this->data,this->cbranch2);
  return;
}

Assistant:

void ConditionalJoin::moveCbranch(void)

{
  Varnode *vn1 = cbranch1->getIn(1);
  Varnode *vn2 = cbranch2->getIn(1);
  data.opUninsert(cbranch1);
  data.opInsertEnd(cbranch1,joinblock);
  Varnode *vn;
  if (vn1 != vn2)
    vn = mergeneed[ MergePair(vn1,vn2) ];
  else
    vn = vn1;
  data.opSetInput(cbranch1,vn,1);
  data.opDestroy(cbranch2);
}